

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O2

void __thiscall
icu_63::RuleCharacterIterator::skipIgnored(RuleCharacterIterator *this,int32_t options)

{
  UBool UVar1;
  uint c;
  
  if ((options & 4U) != 0) {
    while( true ) {
      c = _current(this);
      UVar1 = PatternProps::isWhiteSpace(c);
      if (UVar1 == '\0') break;
      _advance(this,2 - (uint)(c < 0x10000));
    }
  }
  return;
}

Assistant:

void RuleCharacterIterator::skipIgnored(int32_t options) {
    if ((options & SKIP_WHITESPACE) != 0) {
        for (;;) {
            UChar32 a = _current();
            if (!PatternProps::isWhiteSpace(a)) break;
            _advance(U16_LENGTH(a));
        }
    }
}